

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canal.cc
# Opt level: O2

void search<OffsetFreeSymbolMatcher,unsigned_long>
               (csptr *view,OffsetFreeSymbolMatcher *m,Addr loc,AddressRanges *searchaddrs,
               SymbolStore *store,bool showaddrs)

{
  ulong uVar1;
  pointer ppVar2;
  unsigned_long *puVar3;
  ostream *poVar4;
  pair<unsigned_long,_unsigned_long> *range;
  pointer ppVar5;
  ReaderArray<unsigned_long,_131072UL> r;
  IOFlagSave _;
  char local_58;
  AddressRanges *__range4;
  iterator local_40;
  
  pstack::IOFlagSave::IOFlagSave
            ((IOFlagSave *)(r.cache._M_elems + 0x1ffff),
             (ios *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  pstack::ReaderArray<unsigned_long,_131072UL>::ReaderArray
            ((ReaderArray<unsigned_long,_131072UL> *)&stack0xffffffffffeffe68,
             (view->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
  if ((searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (searchaddrs->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_40.arrayp = (ReaderArray<unsigned_long,_131072UL> *)&stack0xffffffffffeffe68;
    for (local_40.idx = 0; local_40.idx != (local_40.arrayp)->eof; local_40.idx = local_40.idx + 1)
    {
      puVar3 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator*(&local_40);
      SymbolStore::find<OffsetFreeSymbolMatcher>((SymbolStore *)&_.field_0x108,store,*puVar3);
      if (local_58 == '\x01') {
        if (showaddrs) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)(_._264_8_ + 0x20));
          poVar4 = std::operator<<(poVar4," 0x");
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar4 = std::operator<<(poVar4," ... size=");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,", diff=");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        *(long *)(_._264_8_ + 0x40) = *(long *)(_._264_8_ + 0x40) + 1;
      }
    }
  }
  else {
    local_40.arrayp = (ReaderArray<unsigned_long,_131072UL> *)&stack0xffffffffffeffe68;
    for (local_40.idx = 0; local_40.idx != (local_40.arrayp)->eof; local_40.idx = local_40.idx + 1)
    {
      puVar3 = pstack::ReaderArray<unsigned_long,_131072UL>::iterator::operator*(&local_40);
      uVar1 = *puVar3;
      ppVar2 = (searchaddrs->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar5 = (searchaddrs->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2;
          ppVar5 = ppVar5 + 1) {
        if ((ppVar5->first <= uVar1) && (uVar1 < ppVar5->second)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"0x");
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::operator<<(poVar4,"\n");
        }
      }
    }
  }
  pstack::IOFlagSave::~IOFlagSave((IOFlagSave *)(r.cache._M_elems + 0x1ffff));
  return;
}

Assistant:

inline void search(
        const Reader::csptr &view,
        const Matcher & m,
        Elf::Addr loc,
        const AddressRanges &searchaddrs,
        SymbolStore &store,
        bool showaddrs) {
    try {
        IOFlagSave _(cout);
        ReaderArray<Word, 131072> r(*view, 0);
        auto start = r.begin();
        if (searchaddrs.size()) {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                for (const auto &range : searchaddrs )
                    if (p >= range.first && p < range.second)
                        cout << "0x" << hex << loc + (cur - start) * sizeof( Word) << dec << "\n";
            }
        } else {
            for (auto cur = start; cur != r.end(); ++cur) {
                Word p = *cur;
                if ( auto [ found, sym ] = store.find(p, m); found) {
                    if (showaddrs)
                        cout
                            << sym->name << " 0x" << std::hex << loc + (cur - start) * sizeof(Word)
                            << std::dec <<  " ... size=" << sym->sym.st_size
                            << ", diff=" << p - sym->memaddr() << endl;
#ifdef WITH_PYTHON
                    if (py) {
                        std::cout << "pyo " << Elf::Addr(loc) << " ";
                        py->print(Elf::Addr(loc) - sizeof (PyObject) +
                                sizeof (struct _typeobject *));
                        std::cout << "\n";
                    }
#endif
                    sym->count++;
                }
            }
        }
    } catch (const std::exception &ex) {
        std::clog << "warning: error reading data at " << std::hex << loc << std::dec << ": " << ex.what() << "\n";
    }
}